

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantUpdateCiSupp(Gia_Man_t *p,int iObj)

{
  uint uVar1;
  Vec_Wrd_t *pVVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = p->nSuppWords;
  uVar3 = uVar1 * iObj;
  if ((-1 < (int)uVar3) && (pVVar2 = p->vSuppWords, (int)uVar3 < pVVar2->nSize)) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if (pVVar2->pArray[uVar3 + uVar4] != 0) goto LAB_00205ea4;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    Gia_ManQuantSetSuppCi(p,p->pObjs + (uint)iObj);
    uVar1 = p->nSuppWords;
    pVVar2 = p->vSuppWords;
    uVar3 = iObj * uVar1;
LAB_00205ea4:
    if ((-1 < (int)uVar3) && ((int)uVar3 < pVVar2->nSize)) {
      if (0 < (int)uVar1) {
        uVar4 = 0;
        do {
          if (pVVar2->pArray[uVar3 + uVar4] != 0) {
            return;
          }
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      __assert_fail("!Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                    ,0xa1,"void Gia_ManQuantUpdateCiSupp(Gia_Man_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Gia_ManQuantUpdateCiSupp( Gia_Man_t * p, int iObj )
{
    if ( Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords ) )
        Gia_ManQuantSetSuppCi( p, Gia_ManObj(p, iObj) );
    assert( !Abc_TtIsConst0( Gia_ManQuantInfoId(p, iObj), p->nSuppWords ) );
}